

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O0

bool __thiscall Plane::intersect(Plane *this,Ray *ray,Hit *h,float tmin)

{
  ulong uVar1;
  float *pfVar2;
  undefined8 *in_RDX;
  Vector2f *in_RSI;
  Vector3f *in_RDI;
  float in_XMM0_Da;
  Vector3f p;
  float t;
  float w;
  float g;
  Vector3f *in_stack_ffffffffffffff68;
  Vector3f *in_stack_ffffffffffffff70;
  float *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar3;
  undefined4 in_stack_ffffffffffffff88;
  Vector2f in_stack_ffffffffffffff90;
  Vector2f in_stack_ffffffffffffff98;
  Vector3f local_3c;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  undefined8 *local_20;
  Vector2f *local_18;
  bool local_1;
  
  fVar3 = in_RDI[3].m_elements[0];
  local_24 = in_XMM0_Da;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = Vector3f::dot(in_RDI,(Vector3f *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_28 = fVar3 - local_28;
  local_2c = Vector3f::dot(in_RDI,(Vector3f *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if ((local_2c != 0.0) || (NAN(local_2c))) {
    local_30 = local_28 / local_2c;
    if ((local_30 < local_24) || (*(float *)(local_20 + 1) <= local_30)) {
      local_1 = false;
    }
    else {
      *(float *)(local_20 + 1) = local_30;
      *local_20 = in_RDI;
      Vector3f::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar1 = (**(code **)(**(long **)(in_RDI[1].m_elements + 1) + 0x10))();
      if ((uVar1 & 1) == 0) {
        Vector2f::Vector2f((Vector2f *)&stack0xffffffffffffff90,0.0,0.0);
        Vector2f::operator=((Vector2f *)in_stack_ffffffffffffff70,
                            (Vector2f *)in_stack_ffffffffffffff68);
      }
      else {
        this_00 = in_RDI[4].m_elements + 1;
        ::operator*((Vector3f *)CONCAT44(fVar3,in_stack_ffffffffffffff88),
                    (float)((ulong)in_RDI >> 0x20));
        ::operator+((Vector3f *)in_stack_ffffffffffffff98.m_elements,
                    (Vector3f *)in_stack_ffffffffffffff90.m_elements);
        ::operator-((Vector3f *)in_stack_ffffffffffffff98.m_elements,
                    (Vector3f *)in_stack_ffffffffffffff90.m_elements);
        ::operator*((Matrix3f *)CONCAT44(fVar3,in_stack_ffffffffffffff88),in_RDI);
        pfVar2 = Vector3f::operator[](&local_3c,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_3c,2);
        Vector2f::Vector2f((Vector2f *)&stack0xffffffffffffff98,fVar3,*pfVar2);
        Vector2f::operator=((Vector2f *)this_00,local_18);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		float g = d - Vector3f::dot(ray.o, norm), w = Vector3f::dot(ray.d, norm);
		if (w == 0) return 0;
		float t = g / w;
		if (t < tmin || t >= h.t) return 0;
		h.t = t; h.obj = this; h.norm = norm;if (m->need_coords()) {
			Vector3f p = matrix * (ray.o + ray.d * t - o);
//			std::cerr << p[0] << "," << p[1] << "," << p[2] << "\n";
			h.pos = Vector2f(p[1], p[2]);
		}
		else h.pos = Vector2f(0, 0);
		return 1;
	}